

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_table.c
# Opt level: O1

int lj_cf_table_insert(lua_State *L)

{
  uint uVar1;
  MSize key;
  uint key_00;
  TValue *pTVar2;
  TValue *pTVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  GCobj *o;
  GCtab *t;
  
  pTVar3 = L->base;
  pTVar2 = L->top;
  if ((pTVar3 < pTVar2) && ((pTVar3->field_2).it == 0xfffffff4)) {
    uVar1 = (pTVar3->u32).lo;
    t = (GCtab *)(ulong)uVar1;
    key = lj_tab_len(t);
    iVar5 = (int)pTVar2 - (int)pTVar3;
    key_00 = key + 1;
    if (iVar5 != 0x10) {
      if (iVar5 != 0x18) {
        lj_err_caller(L,LJ_ERR_TABINS);
      }
      key_00 = lj_lib_checkint(L,2);
      if ((int)key_00 <= (int)key) {
        lVar7 = (long)(int)(key + 1);
        lVar6 = lVar7 * 8;
        do {
          if (key + 1 < t->asize) {
            pTVar3 = (TValue *)((ulong)(t->array).ptr32 + lVar6);
          }
          else {
            pTVar3 = lj_tab_setinth(L,t,key + 1);
          }
          if (key < t->asize) {
            pTVar2 = (TValue *)((ulong)(t->array).ptr32 + lVar6 + -8);
          }
          else {
            pTVar2 = lj_tab_getinth(t,key);
          }
          if (pTVar2 == (TValue *)0x0) {
            (pTVar3->field_2).it = 0xffffffff;
          }
          else {
            *pTVar3 = *pTVar2;
          }
          lVar7 = lVar7 + -1;
          key = key - 1;
          lVar6 = lVar6 + -8;
        } while ((int)key_00 < lVar7);
      }
    }
    if (key_00 < t->asize) {
      pTVar3 = (TValue *)((ulong)(t->array).ptr32 + (long)(int)key_00 * 8);
    }
    else {
      pTVar3 = lj_tab_setinth(L,t,key_00);
    }
    *pTVar3 = L->top[-1];
    if ((((pTVar3->field_2).it + 0xd < 9) && ((*(byte *)((ulong)(pTVar3->u32).lo + 4) & 3) != 0)) &&
       ((t->marked & 4) != 0)) {
      uVar4 = (ulong)(L->glref).ptr32;
      t->marked = t->marked & 0xfb;
      (t->gclist).gcptr32 = *(uint32_t *)(uVar4 + 0x3c);
      *(uint *)(uVar4 + 0x3c) = uVar1;
    }
    return 0;
  }
  lj_err_argt(L,1,5);
}

Assistant:

LJLIB_CF(table_insert)		LJLIB_REC(.)
{
  GCtab *t = lj_lib_checktab(L, 1);
  int32_t n, i = (int32_t)lj_tab_len(t) + 1;
  int nargs = (int)((char *)L->top - (char *)L->base);
  if (nargs != 2*sizeof(TValue)) {
    if (nargs != 3*sizeof(TValue))
      lj_err_caller(L, LJ_ERR_TABINS);
    /* NOBARRIER: This just moves existing elements around. */
    for (n = lj_lib_checkint(L, 2); i > n; i--) {
      /* The set may invalidate the get pointer, so need to do it first! */
      TValue *dst = lj_tab_setint(L, t, i);
      cTValue *src = lj_tab_getint(t, i-1);
      if (src) {
	copyTV(L, dst, src);
      } else {
	setnilV(dst);
      }
    }
    i = n;
  }
  {
    TValue *dst = lj_tab_setint(L, t, i);
    copyTV(L, dst, L->top-1);  /* Set new value. */
    lj_gc_barriert(L, t, dst);
  }
  return 0;
}